

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O1

_Bool bitset_array_container_andnot
                (bitset_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  bitset_container_t *dest;
  uint64_t uVar1;
  array_container_t *paVar2;
  int iVar3;
  
  dest = bitset_container_create();
  bitset_container_copy(src_1,dest);
  uVar1 = bitset_clear_list(dest->words,(long)dest->cardinality,src_2->array,
                            (long)src_2->cardinality);
  iVar3 = (int)uVar1;
  dest->cardinality = iVar3;
  if (iVar3 < 0x1001) {
    paVar2 = array_container_from_bitset(dest);
    *dst = paVar2;
    bitset_container_free(dest);
  }
  else {
    *dst = dest;
  }
  return 0x1000 < iVar3;
}

Assistant:

bool bitset_array_container_andnot(const bitset_container_t *src_1,
                                   const array_container_t *src_2,
                                   container_t **dst) {
    // Java did this directly, but we have option of asm or avx
    bitset_container_t *result = bitset_container_create();
    bitset_container_copy(src_1, result);
    result->cardinality =
        (int32_t)bitset_clear_list(result->words, (uint64_t)result->cardinality,
                                   src_2->array, (uint64_t)src_2->cardinality);

    // do required type conversions.
    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;
    }
    *dst = result;
    return true;
}